

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O1

string * __thiscall
TargetFilesystemArtifactResultCreator<ArtifactSonameTag>::Create_abi_cxx11_
          (string *__return_storage_ptr__,
          TargetFilesystemArtifactResultCreator<ArtifactSonameTag> *this,cmGeneratorTarget *target,
          cmGeneratorExpressionContext *context,GeneratorExpressionContent *content)

{
  bool bVar1;
  TargetType TVar2;
  _Base_ptr *config;
  string local_60;
  string local_40;
  
  bVar1 = cmGeneratorTarget::IsDLLPlatform((cmGeneratorTarget *)this);
  if (bVar1) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_60,(GeneratorExpressionContent *)context);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"TARGET_SONAME_FILE is not allowed for DLL target platforms.","")
    ;
    reportError((cmGeneratorExpressionContext *)target,&local_60,&local_40);
  }
  else {
    TVar2 = cmGeneratorTarget::GetType((cmGeneratorTarget *)this);
    if (TVar2 == SHARED_LIBRARY) {
      config = &(target->ExplicitObjectName)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      cmGeneratorTarget::GetDirectory
                (__return_storage_ptr__,(cmGeneratorTarget *)this,(string *)config,
                 RuntimeBinaryArtifact);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      cmGeneratorTarget::GetSOName(&local_60,(cmGeneratorTarget *)this,(string *)config);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_60._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p == &local_60.field_2) {
        return __return_storage_ptr__;
      }
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      return __return_storage_ptr__;
    }
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_60,(GeneratorExpressionContent *)context);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"TARGET_SONAME_FILE is allowed only for SHARED libraries.","");
    reportError((cmGeneratorExpressionContext *)target,&local_60,&local_40);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

static std::string Create(cmGeneratorTarget* target,
                            cmGeneratorExpressionContext* context,
                            const GeneratorExpressionContent* content)
  {
    // The target soname file (.so.1).
    if (target->IsDLLPlatform()) {
      ::reportError(context, content->GetOriginalExpression(),
                    "TARGET_SONAME_FILE is not allowed "
                    "for DLL target platforms.");
      return std::string();
    }
    if (target->GetType() != cmStateEnums::SHARED_LIBRARY) {
      ::reportError(context, content->GetOriginalExpression(),
                    "TARGET_SONAME_FILE is allowed only for "
                    "SHARED libraries.");
      return std::string();
    }
    std::string result = target->GetDirectory(context->Config);
    result += "/";
    result += target->GetSOName(context->Config);
    return result;
  }